

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::ShouldUseColor(bool stdout_is_tty)

{
  bool bVar1;
  char *pcVar2;
  bool local_24;
  bool local_23;
  bool local_22;
  bool term_supports_color;
  char *term;
  char *gtest_color;
  bool stdout_is_tty_local;
  
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      FLAGS_gtest_color_abi_cxx11_);
  bVar1 = String::CaseInsensitiveCStringEquals(pcVar2,"auto");
  if (bVar1) {
    pcVar2 = posix::GetEnv("TERM");
    bVar1 = String::CStringEquals(pcVar2,"xterm");
    local_22 = true;
    if (!bVar1) {
      bVar1 = String::CStringEquals(pcVar2,"xterm-color");
      local_22 = true;
      if (!bVar1) {
        bVar1 = String::CStringEquals(pcVar2,"xterm-256color");
        local_22 = true;
        if (!bVar1) {
          bVar1 = String::CStringEquals(pcVar2,"screen");
          local_22 = true;
          if (!bVar1) {
            bVar1 = String::CStringEquals(pcVar2,"screen-256color");
            local_22 = true;
            if (!bVar1) {
              bVar1 = String::CStringEquals(pcVar2,"tmux");
              local_22 = true;
              if (!bVar1) {
                bVar1 = String::CStringEquals(pcVar2,"tmux-256color");
                local_22 = true;
                if (!bVar1) {
                  bVar1 = String::CStringEquals(pcVar2,"rxvt-unicode");
                  local_22 = true;
                  if (!bVar1) {
                    bVar1 = String::CStringEquals(pcVar2,"rxvt-unicode-256color");
                    local_22 = true;
                    if (!bVar1) {
                      bVar1 = String::CStringEquals(pcVar2,"linux");
                      local_22 = true;
                      if (!bVar1) {
                        local_22 = String::CStringEquals(pcVar2,"cygwin");
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_23 = false;
    if (stdout_is_tty) {
      local_23 = local_22;
    }
    gtest_color._7_1_ = local_23;
  }
  else {
    bVar1 = String::CaseInsensitiveCStringEquals(pcVar2,"yes");
    local_24 = true;
    if (!bVar1) {
      bVar1 = String::CaseInsensitiveCStringEquals(pcVar2,"true");
      local_24 = true;
      if (!bVar1) {
        bVar1 = String::CaseInsensitiveCStringEquals(pcVar2,"t");
        local_24 = true;
        if (!bVar1) {
          local_24 = String::CStringEquals(pcVar2,"1");
        }
      }
    }
    gtest_color._7_1_ = local_24;
  }
  return gtest_color._7_1_;
}

Assistant:

bool ShouldUseColor(bool stdout_is_tty) {
  const char* const gtest_color = GTEST_FLAG(color).c_str();

  if (String::CaseInsensitiveCStringEquals(gtest_color, "auto")) {
#if GTEST_OS_WINDOWS && !GTEST_OS_WINDOWS_MINGW
    // On Windows the TERM variable is usually not set, but the
    // console there does support colors.
    return stdout_is_tty;
#else
    // On non-Windows platforms, we rely on the TERM variable.
    const char* const term = posix::GetEnv("TERM");
    const bool term_supports_color =
        String::CStringEquals(term, "xterm") ||
        String::CStringEquals(term, "xterm-color") ||
        String::CStringEquals(term, "xterm-256color") ||
        String::CStringEquals(term, "screen") ||
        String::CStringEquals(term, "screen-256color") ||
        String::CStringEquals(term, "tmux") ||
        String::CStringEquals(term, "tmux-256color") ||
        String::CStringEquals(term, "rxvt-unicode") ||
        String::CStringEquals(term, "rxvt-unicode-256color") ||
        String::CStringEquals(term, "linux") ||
        String::CStringEquals(term, "cygwin");
    return stdout_is_tty && term_supports_color;
#endif  // GTEST_OS_WINDOWS
  }

  return String::CaseInsensitiveCStringEquals(gtest_color, "yes") ||
      String::CaseInsensitiveCStringEquals(gtest_color, "true") ||
      String::CaseInsensitiveCStringEquals(gtest_color, "t") ||
      String::CStringEquals(gtest_color, "1");
  // We take "yes", "true", "t", and "1" as meaning "yes".  If the
  // value is neither one of these nor "auto", we treat it as "no" to
  // be conservative.
}